

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *ridx,int *rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  uint uVar4;
  fpclass_type fVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  uint *puVar21;
  int iVar22;
  byte bVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  ulong local_420;
  undefined1 local_408 [32];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [13];
  undefined3 uStack_39b;
  int iStack_398;
  bool bStack_394;
  undefined8 local_390;
  ulong local_388;
  int *local_380;
  pointer local_378;
  int *local_370;
  int *local_368;
  int *local_360;
  int *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  ulong local_348;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_340;
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [13];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar23 = 0;
  local_2c0._0_4_ = cpp_dec_float_finite;
  local_2c0._4_4_ = 0x1c;
  local_338._0_16_ = (undefined1  [16])0x0;
  local_338._16_16_ = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = false;
  local_378 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_380 = (this->l).idx;
  local_358 = (this->l).row;
  local_370 = (this->l).start;
  local_420 = (ulong)(this->l).firstUpdate;
  local_368 = ridx;
  local_360 = rn;
  local_350 = eps;
  if ((long)local_420 < 1) {
    local_420 = 0;
  }
  else {
    uVar14 = 0;
    local_340 = this;
    do {
      iVar9 = local_358[uVar14];
      pnVar18 = vec + iVar9;
      puVar19 = (uint *)local_338;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar19 = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
        puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
      }
      iVar22 = vec[iVar9].m_backend.exp;
      iStack_2c8 = iVar22;
      bVar1 = vec[iVar9].m_backend.neg;
      bStack_2c4 = bVar1;
      fVar2 = vec[iVar9].m_backend.fpclass;
      iVar3 = vec[iVar9].m_backend.prec_elem;
      local_2c0._4_4_ = iVar3;
      local_2c0._0_4_ = fVar2;
      pnVar18 = vec + iVar9;
      puVar19 = (uint *)local_408;
      local_348 = uVar14;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar19 = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
        puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
      }
      pnVar18 = local_350;
      pcVar16 = &local_b0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_b0.exp = (local_350->m_backend).exp;
      local_b0.neg = (local_350->m_backend).neg;
      fVar5 = (local_350->m_backend).fpclass;
      iVar7 = (local_350->m_backend).prec_elem;
      local_b0.fpclass = fVar5;
      local_b0.prec_elem = iVar7;
      local_390._4_4_ = iVar3;
      local_390._0_4_ = fVar2;
      bStack_394 = bVar1;
      if ((bVar1 == true) && (local_408._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
        bStack_394 = false;
      }
      if ((fVar5 != cpp_dec_float_NaN && fVar2 != cpp_dec_float_NaN) &&
         (iStack_398 = iVar22,
         iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_408,&local_b0), 0 < iVar9)) {
        iVar9 = local_370[local_348];
        iVar22 = local_370[local_348 + 1];
        if (iVar9 < iVar22) {
          pcVar16 = &local_378[iVar9].m_backend;
          piVar15 = local_380 + iVar9;
          do {
            iVar10 = *piVar15;
            local_1c0._0_4_ = cpp_dec_float_finite;
            local_1c0._4_4_ = 0x1c;
            local_238 = (undefined1  [16])0x0;
            local_228 = (undefined1  [16])0x0;
            local_218 = (undefined1  [16])0x0;
            local_208 = (undefined1  [16])0x0;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8 = SUB1613((undefined1  [16])0x0,0);
            uStack_1cb = 0;
            iStack_1c8 = 0;
            bStack_1c4 = false;
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_338;
            if (pcVar16 != (cpp_dec_float<200U,_int,_void> *)local_238) {
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_238;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar17->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4)
                ;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4)
                ;
              }
              iStack_1c8 = iStack_2c8;
              bStack_1c4 = bStack_2c4;
              local_1c0._0_4_ = (fpclass_type)local_2c0;
              local_1c0._4_4_ = local_2c0._4_4_;
              pcVar20 = pcVar16;
            }
            local_388 = CONCAT44(local_388._4_4_,iVar10);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_238,pcVar20);
            pcVar20 = &vec[iVar10].m_backend;
            if (vec[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
              local_390._0_4_ = cpp_dec_float_finite;
              local_390._4_4_ = 0x1c;
              local_408._0_16_ = (undefined1  [16])0x0;
              local_408._16_16_ = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8 = (undefined1  [16])0x0;
              local_3c8 = (undefined1  [16])0x0;
              local_3b8 = (undefined1  [16])0x0;
              local_3a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_39b = 0;
              iStack_398 = 0;
              bStack_394 = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
              pcVar17 = pcVar11;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_408;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar12->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4)
                ;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
              }
              iStack_398 = pcVar11->exp;
              bStack_394 = pcVar11->neg;
              local_390._0_4_ = pcVar11->fpclass;
              local_390._4_4_ = pcVar11->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar20,(cpp_dec_float<200U,_int,_void> *)local_408);
              if (iVar10 == 0) {
                local_368[*local_360] = (int)local_388;
                *local_360 = *local_360 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (pcVar20,(cpp_dec_float<200U,_int,_void> *)local_238);
            if (pcVar20->fpclass != cpp_dec_float_NaN) {
              local_390._0_4_ = cpp_dec_float_finite;
              local_390._4_4_ = 0x1c;
              local_408._0_16_ = (undefined1  [16])0x0;
              local_408._16_16_ = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8 = (undefined1  [16])0x0;
              local_3c8 = (undefined1  [16])0x0;
              local_3b8 = (undefined1  [16])0x0;
              local_3a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_39b = 0;
              iStack_398 = 0;
              bStack_394 = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
              pcVar17 = pcVar11;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_408;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar12->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4)
                ;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
              }
              iStack_398 = pcVar11->exp;
              bStack_394 = pcVar11->neg;
              local_390._0_4_ = pcVar11->fpclass;
              local_390._4_4_ = pcVar11->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar20,(cpp_dec_float<200U,_int,_void> *)local_408);
              if (iVar10 == 0) {
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)pcVar20,1e-100);
              }
            }
            piVar15 = piVar15 + 1;
            pcVar16 = pcVar16 + 1;
            iVar22 = iVar22 + -1;
          } while (iVar9 < iVar22);
        }
      }
      uVar14 = local_348 + 1;
      this = local_340;
    } while (uVar14 != local_420);
  }
  if ((this->l).updateType != 0) {
    uVar4 = (this->l).firstUnused;
    if ((int)local_420 < (int)uVar4) {
      local_420 = local_420 & 0xffffffff;
      do {
        iVar9 = local_370[local_420];
        local_240._0_4_ = cpp_dec_float_finite;
        local_240._4_4_ = 0x1c;
        local_2b8._0_16_ = (undefined1  [16])0x0;
        local_2b8._16_16_ = (undefined1  [16])0x0;
        local_298 = (undefined1  [16])0x0;
        local_288 = (undefined1  [16])0x0;
        local_278 = (undefined1  [16])0x0;
        local_268 = (undefined1  [16])0x0;
        local_258 = SUB1613((undefined1  [16])0x0,0);
        uStack_24b = 0;
        iStack_248 = 0;
        bStack_244 = false;
        iVar22 = local_370[local_420 + 1];
        if (iVar9 < iVar22) {
          pcVar16 = &local_378[iVar9].m_backend;
          piVar15 = local_380 + iVar9;
          local_388 = local_420;
          do {
            pcVar17 = &vec[*piVar15].m_backend;
            local_390._0_4_ = cpp_dec_float_finite;
            local_390._4_4_ = 0x1c;
            local_408._0_16_ = (undefined1  [16])0x0;
            local_408._16_16_ = (undefined1  [16])0x0;
            local_3e8 = (undefined1  [16])0x0;
            local_3d8 = (undefined1  [16])0x0;
            local_3c8 = (undefined1  [16])0x0;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = SUB1613((undefined1  [16])0x0,0);
            uStack_39b = 0;
            iStack_398 = 0;
            bStack_394 = false;
            pcVar20 = pcVar17;
            if ((pcVar16 != (cpp_dec_float<200U,_int,_void> *)local_408) &&
               (pcVar20 = pcVar16, (cpp_dec_float<200U,_int,_void> *)local_408 != pcVar17)) {
              pcVar12 = pcVar17;
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_408;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar11->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar23 * -8 + 4)
                ;
              }
              iStack_398 = pcVar17->exp;
              bStack_394 = pcVar17->neg;
              local_390._0_4_ = pcVar17->fpclass;
              local_390._4_4_ = pcVar17->prec_elem;
            }
            piVar15 = piVar15 + 1;
            pcVar16 = pcVar16 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_408,pcVar20);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                       (cpp_dec_float<200U,_int,_void> *)local_408);
            iVar22 = iVar22 + -1;
          } while (iVar9 < iVar22);
          local_420 = local_388;
          local_390._0_4_ = (fpclass_type)local_240;
          local_390._4_4_ = local_240._4_4_;
        }
        else {
          local_390._0_4_ = cpp_dec_float_finite;
          local_390._4_4_ = 0x1c;
        }
        bStack_394 = bStack_244;
        iStack_398 = iStack_248;
        iVar9 = local_358[local_420];
        puVar19 = (uint *)local_2b8;
        puVar21 = (uint *)local_338;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar21 = *puVar19;
          puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
          puVar21 = puVar21 + (ulong)bVar23 * -2 + 1;
        }
        iStack_2c8 = iStack_398;
        bStack_2c4 = bStack_394;
        local_2c0._4_4_ = local_390._4_4_;
        local_2c0._0_4_ = (fpclass_type)local_390;
        puVar19 = (uint *)local_2b8;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_408;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        }
        pnVar18 = local_350;
        pcVar16 = &local_130;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
        }
        local_130.exp = (local_350->m_backend).exp;
        local_130.neg = (local_350->m_backend).neg;
        fVar6 = (local_350->m_backend).fpclass;
        iVar8 = (local_350->m_backend).prec_elem;
        local_130.fpclass = fVar6;
        local_130.prec_elem = iVar8;
        if (((bStack_394 & 1U) != 0) &&
           (local_408._0_4_ != 0 || (fpclass_type)local_390 != cpp_dec_float_finite)) {
          bStack_394 = (bool)(bStack_394 ^ 1);
        }
        if ((fVar6 != cpp_dec_float_NaN && (fpclass_type)local_390 != cpp_dec_float_NaN) &&
           (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_408,&local_130), 0 < iVar22)
           ) {
          puVar19 = (uint *)local_338;
          pcVar16 = &local_1b0;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar16->data)._M_elems[0] = *puVar19;
            puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_1b0.exp = iStack_2c8;
          local_1b0.neg = bStack_2c4;
          local_1b0.fpclass = (fpclass_type)local_2c0;
          local_1b0.prec_elem = local_2c0._4_4_;
          pcVar16 = &vec[iVar9].m_backend;
          if (vec[iVar9].m_backend.fpclass != cpp_dec_float_NaN) {
            local_390._0_4_ = cpp_dec_float_finite;
            local_390._4_4_ = 0x1c;
            local_408._0_16_ = (undefined1  [16])0x0;
            local_408._16_16_ = (undefined1  [16])0x0;
            local_3e8 = (undefined1  [16])0x0;
            local_3d8 = (undefined1  [16])0x0;
            local_3c8 = (undefined1  [16])0x0;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = SUB1613((undefined1  [16])0x0,0);
            uStack_39b = 0;
            iStack_398 = 0;
            bStack_394 = false;
            pcVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
            pcVar20 = pcVar12;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_408;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
            }
            iStack_398 = pcVar12->exp;
            bStack_394 = pcVar12->neg;
            local_390._0_4_ = pcVar12->fpclass;
            local_390._4_4_ = pcVar12->prec_elem;
            iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar16,(cpp_dec_float<200U,_int,_void> *)local_408);
            if (iVar22 == 0) {
              local_368[*local_360] = iVar9;
              *local_360 = *local_360 + 1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (pcVar16,&local_1b0);
          if (pcVar16->fpclass != cpp_dec_float_NaN) {
            local_390._0_4_ = cpp_dec_float_finite;
            local_390._4_4_ = 0x1c;
            local_408._0_16_ = (undefined1  [16])0x0;
            local_408._16_16_ = (undefined1  [16])0x0;
            local_3e8 = (undefined1  [16])0x0;
            local_3d8 = (undefined1  [16])0x0;
            local_3c8 = (undefined1  [16])0x0;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = SUB1613((undefined1  [16])0x0,0);
            uStack_39b = 0;
            iStack_398 = 0;
            bStack_394 = false;
            pcVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
            pcVar20 = pcVar12;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_408;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
            }
            iStack_398 = pcVar12->exp;
            bStack_394 = pcVar12->neg;
            local_390._0_4_ = pcVar12->fpclass;
            local_390._4_4_ = pcVar12->prec_elem;
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar16,(cpp_dec_float<200U,_int,_void> *)local_408);
            if (iVar9 == 0) {
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)pcVar16,1e-100);
            }
          }
        }
        local_420 = local_420 + 1;
      } while (local_420 != uVar4);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright(R* vec, int* ridx, int& rn, R eps)
{
   int i, j, k, n;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      x = vec[lrow[i]];

      // check whether there is a corresponding value in the rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // apply \f$- x * L_{k,i}\f$ to all corresponding values in rhs/solution VectorBase<R>
         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp += vec[*idx++] * (*val++);
         }

         j = lrow[i];
         x = R(tmp);

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);
      }
   }
}